

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O2

void __thiscall cs222::Pass2::readSymbols(Pass2 *this)

{
  long lVar1;
  int iVar2;
  char cVar3;
  mapped_type *pmVar4;
  runtime_error *this_00;
  stringstream *this_01;
  int address_1;
  string litTabPath;
  int address;
  size_type local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  string symTabPath;
  stringstream buf;
  ostream local_3b0 [8];
  uint auStack_3a8 [2];
  byte abStack_3a0 [360];
  ifstream ifs;
  streambuf local_228 [16];
  byte abStack_218 [488];
  
  std::operator+(&symTabPath,&this->srcFileName,".symtab");
  std::ifstream::ifstream(&ifs,(string *)&symTabPath,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&litTabPath,"Cannot open file: ",(allocator *)&address);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                   &litTabPath,&symTabPath);
    std::runtime_error::runtime_error(this_00,(string *)&buf);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                 "Reading SYMTAB from ",&symTabPath);
  logDebug((string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    litTabPath._M_dataplus._M_p = (pointer)&litTabPath.field_2;
    litTabPath._M_string_length = 0;
    litTabPath.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)&buf);
    std::ostream::operator<<(local_3b0,local_228);
    std::ifstream::close();
    std::operator>>((istream *)&buf,(string *)&litTabPath);
    std::operator>>((istream *)&buf,(string *)&litTabPath);
    while ((abStack_3a0[*(long *)(_buf + -0x18)] & 5) == 0) {
      std::operator>>((istream *)&buf,(string *)&litTabPath);
      lVar1 = *(long *)(_buf + -0x18);
      if ((abStack_3a0[lVar1] & 5) != 0) break;
      *(uint *)((long)auStack_3a8 + lVar1) = *(uint *)((long)auStack_3a8 + lVar1) & 0xffffffb5 | 8;
      std::istream::operator>>((istream *)&buf,&address);
      if ((abStack_3a0[*(long *)(_buf + -0x18)] & 5) != 0) break;
      iVar2 = address;
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->symTab,&litTabPath);
      *pmVar4 = iVar2;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&buf);
    std::__cxx11::string::~string((string *)&litTabPath);
  }
  std::operator+(&litTabPath,&this->srcFileName,".littab");
  std::ifstream::open((string *)&ifs,(_Ios_Openmode)&litTabPath);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                   "Reading LITTAB from ",&litTabPath);
    logDebug((string *)&buf);
    std::__cxx11::string::~string((string *)&buf);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') goto LAB_00113c77;
    _address = (pointer)&local_3f0;
    local_3f8 = 0;
    local_3f0._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)&buf);
    std::ostream::operator<<(local_3b0,local_228);
    std::ifstream::close();
    std::operator>>((istream *)&buf,(string *)&address);
    std::operator>>((istream *)&buf,(string *)&address);
    while ((abStack_3a0[*(long *)(_buf + -0x18)] & 5) == 0) {
      std::operator>>((istream *)&buf,(string *)&address);
      lVar1 = *(long *)(_buf + -0x18);
      if ((abStack_3a0[lVar1] & 5) != 0) break;
      *(uint *)((long)auStack_3a8 + lVar1) = *(uint *)((long)auStack_3a8 + lVar1) & 0xffffffb5 | 8;
      std::istream::operator>>((istream *)&buf,&address_1);
      iVar2 = address_1;
      if ((abStack_3a0[*(long *)(_buf + -0x18)] & 5) != 0) break;
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->litTab,(key_type *)&address);
      *pmVar4 = iVar2;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&buf);
    this_01 = (stringstream *)&address;
  }
  else {
    std::__cxx11::string::string((string *)&buf,"No LITTAB present",(allocator *)&address);
    logDebug((string *)&buf);
    this_01 = &buf;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_00113c77:
  std::__cxx11::string::~string((string *)&litTabPath);
  std::ifstream::~ifstream(&ifs);
  std::__cxx11::string::~string((string *)&symTabPath);
  return;
}

Assistant:

void Pass2::readSymbols() {
        // reading from symTab
        std::string symTabPath = srcFileName + ".symtab";
        std::ifstream ifs(symTabPath);

        if (!ifs)
            throw std::runtime_error(std::string("Cannot open file: ") + symTabPath);

        logDebug("Reading SYMTAB from " + symTabPath);

        if (ifs.is_open()) {

            std::string key;
            int address;
            std::stringstream buf;

            buf << ifs.rdbuf();

            ifs.close();

            // ignoring SYMBOL & ADDRESS
            buf >> key;
            buf >> key;

            while (buf)
            {
                buf >> key;
                if (!buf)
                    break;
                //std::cout << key << "\t";

                buf >> std::hex >> address;
                if (!buf)
                    break;
                //std::cout << std::hex << address << std::endl;

                symTab[key] = address;
            }
        }

        //reading from litTab
        std::string litTabPath = srcFileName + ".littab";

        ifs.open(litTabPath);

        if (!ifs){
            logDebug("No LITTAB present");
            return;
        }

        logDebug("Reading LITTAB from " + litTabPath);

        if (ifs.is_open()) {

            std::string key;
            int address;
            std::stringstream buf;

            buf << ifs.rdbuf();
            ifs.close();

            // ignoring SYMBOL & ADDRESS
            buf >> key;
            buf >> key;

            while (buf)
            {
                buf >> key;
                if (!buf)
                    break;
                //std::cout << key << "\t";

                buf >> std::hex >> address;
                if (!buf)
                    break;
                //std::cout << std::hex << address << std::endl;

                litTab[key] = address;
            }
        }

    }